

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

bool __thiscall ON_Font::SetAppleWeightOfFont(ON_Font *this,int apple_weight_of_font)

{
  Weight font_weight;
  bool bVar1;
  double dVar2;
  double local_20;
  
  font_weight = WeightFromAppleWeightOfFont(apple_weight_of_font);
  local_20 = AppleFontWeightTraitFromWeight(font_weight);
  if ((uint)apple_weight_of_font < 10) {
    dVar2 = (1.0 - (double)apple_weight_of_font) / 7.5;
    local_20 = -1.0;
    if ((-1.0 <= dVar2) && (local_20 = dVar2, 1.0 < dVar2)) {
      local_20 = 1.0;
    }
  }
  PostScriptName((ON_Font *)&stack0xffffffffffffffd8);
  ON_wString::IsEmpty((ON_wString *)&stack0xffffffffffffffd8);
  bVar1 = Internal_SetFontWeightTrio(this,font_weight,-1,local_20,false);
  ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffd8);
  return bVar1;
}

Assistant:

bool ON_Font::SetAppleWeightOfFont(
  int apple_weight_of_font
)
{
  const ON_Font::Weight font_weight = ON_Font::WeightFromAppleWeightOfFont(apple_weight_of_font);
  double apple_font_weight_trait = ON_Font::AppleFontWeightTraitFromWeight(font_weight);
  if (0 <= apple_weight_of_font && apple_weight_of_font <= 9)
  {
    apple_font_weight_trait = (1.0 - apple_weight_of_font) / 7.5;
    if (apple_font_weight_trait < -1.0)
      apple_font_weight_trait = -1.0;
    else if (apple_font_weight_trait > 1.0)
      apple_font_weight_trait = 1.0;    
  }
  return Internal_SetFontWeightTrio(
    font_weight, 
    -1, 
    apple_font_weight_trait,
    PostScriptName().IsEmpty()
  );
}